

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

int_fast64_t absl::time_internal::cctz::anon_unknown_0::Decode64(char *cp)

{
  byte bVar1;
  uint_fast64_t s64maxU;
  int_fast64_t s64max;
  ulong uStack_20;
  int i;
  uint_fast64_t v;
  char *cp_local;
  
  uStack_20 = 0;
  v = (uint_fast64_t)cp;
  for (s64max._4_4_ = 0; s64max._4_4_ != 8; s64max._4_4_ = s64max._4_4_ + 1) {
    bVar1 = Decode8((char *)v);
    uStack_20 = uStack_20 << 8 | (ulong)bVar1;
    v = v + 1;
  }
  return uStack_20;
}

Assistant:

std::int_fast64_t Decode64(const char* cp) {
  std::uint_fast64_t v = 0;
  for (int i = 0; i != (64 / 8); ++i) v = (v << 8) | Decode8(cp++);
  const std::int_fast64_t s64max = 0x7fffffffffffffff;
  const auto s64maxU = static_cast<std::uint_fast64_t>(s64max);
  if (v <= s64maxU) return static_cast<std::int_fast64_t>(v);
  return static_cast<std::int_fast64_t>(v - s64maxU - 1) - s64max - 1;
}